

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcole.c
# Opt level: O2

int ffgcfc(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
          float *array,char *nularray,int *anynul,int *status)

{
  char *nularray_00;
  long lVar1;
  bool bVar2;
  
  nularray_00 = (char *)calloc(nelem * 2,1);
  ffgcle(fptr,colnum,firstrow,firstelem * 2 + -1,nelem * 2,1,2,0.0,array,nularray_00,anynul,status);
  lVar1 = 0;
  if (nelem < 1) {
    nelem = lVar1;
  }
  for (; nelem != lVar1; lVar1 = lVar1 + 1) {
    bVar2 = true;
    if (nularray_00[lVar1 * 2] == '\0') {
      bVar2 = nularray_00[lVar1 * 2 + 1] != '\0';
    }
    nularray[lVar1] = bVar2;
  }
  free(nularray_00);
  return *status;
}

Assistant:

int ffgcfc(fitsfile *fptr,   /* I - FITS file pointer                       */
           int  colnum,      /* I - number of column to read (1 = 1st col)  */
           LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)         */
           LONGLONG  firstelem,  /* I - first vector element to read (1 = 1st)  */
           LONGLONG  nelem,      /* I - number of values to read                */
           float *array,     /* O - array of values that are read           */
           char *nularray,   /* O - array of flags: 1 if null pixel; else 0 */
           int  *anynul,     /* O - set to 1 if any values are null; else 0 */
           int  *status)     /* IO - error status                           */
/*
  Read an array of values from a column in the current FITS HDU. Automatic
  datatype conversion will be performed if the datatype of the column does not
  match the datatype of the array parameter. The output values will be scaled 
  by the FITS TSCALn and TZEROn values if these values have been defined.
  Nularray will be set = 1 if the corresponding array pixel is undefined, 
  otherwise nularray will = 0.

  TSCAL and ZERO should not be used with complex values. 
*/
{
    LONGLONG ii, jj;
    float dummy = 0;
    char *carray;

    /* a complex value is interpreted as a pair of float values, thus */
    /* need to multiply the first element and number of elements by 2 */
    
    /* allocate temporary array */
    carray = (char *) calloc( (size_t) (nelem * 2), 1); 

    ffgcle(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2,
           1, 2, dummy, array, carray, anynul, status);

    for (ii = 0, jj = 0; jj < nelem; ii += 2, jj++)
    {
       if (carray[ii] || carray[ii + 1])
          nularray[jj] = 1;
       else
          nularray[jj] = 0;
    }

    free(carray);    
    return(*status);
}